

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.hh
# Opt level: O0

void __thiscall Enumerator::Enumerator(Enumerator *this,string *nm)

{
  string *nm_local;
  Enumerator *this_local;
  
  std::__cxx11::string::string((string *)this);
  this->constantassigned = false;
  std::__cxx11::string::operator=((string *)this,(string *)nm);
  return;
}

Assistant:

Enumerator(const string &nm) { constantassigned = false; enumconstant = nm; }